

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_strip_tags(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  ulong in_RAX;
  char *zIn;
  char *zTaglist;
  int nTaglen;
  int nLen;
  undefined8 local_28;
  
  local_28 = in_RAX & 0xffffffff00000000;
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9_value_string(pCtx->pRet,"",0);
  }
  else {
    zIn = jx9_value_to_string(*apArg,(int *)((long)&local_28 + 4));
    if ((nArg == 1) || ((apArg[1]->iFlags & 1) == 0)) {
      zTaglist = (char *)0x0;
    }
    else {
      zTaglist = jx9_value_to_string(apArg[1],(int *)&local_28);
    }
    jx9StripTagsFromString(pCtx,zIn,local_28._4_4_,zTaglist,(int)local_28);
  }
  return 0;
}

Assistant:

static int jx9Builtin_strip_tags(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zTaglist = 0;
	const char *zString;
	int nTaglen = 0;
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Point to the raw string */
	zString = jx9_value_to_string(apArg[0], &nLen);
	if( nArg > 1 && jx9_value_is_string(apArg[1]) ){
		/* Allowed tag */
		zTaglist = jx9_value_to_string(apArg[1], &nTaglen);		
	}
	/* Process input */
	jx9StripTagsFromString(pCtx, zString, nLen, zTaglist, nTaglen);
	return JX9_OK;
}